

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

target_ulong helper_mret_riscv64(CPURISCVState_conflict2 *env,target_ulong cpu_pc_deb)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uintptr_t unaff_retaddr;
  
  if (env->priv < 3) {
    riscv_raise_exception_riscv64(env,2,unaff_retaddr);
  }
  uVar1 = env->mepc;
  if ((uVar1 & 3) == 0 || (env->misa & 4) != 0) {
    uVar2 = env->mstatus;
    uVar4 = (uint)(uVar2 >> 0xb) & 3;
    uVar5 = 8;
    if (env->priv_ver < 0x11000) {
      uVar5 = (ulong)(uint)(1 << (sbyte)uVar4);
    }
    uVar3 = (uint)uVar5;
    uVar6 = 0;
    if ((char)uVar2 < '\0') {
      uVar6 = ~(uVar3 * 2) & uVar3;
    }
    env->mstatus = uVar2 & 0xffffff7fffffe77f & ~uVar5 | (ulong)(uVar6 & uVar3) | 0x80;
    riscv_cpu_set_mode_riscv64((CPURISCVState_conflict1 *)env,(ulong)uVar4);
    if ((env->misa & 0x80) != 0) {
      if ((uVar2 >> 0x27 & 1) != 0) {
        riscv_cpu_swap_hypervisor_regs_riscv64((CPURISCVState_conflict1 *)env);
      }
      riscv_cpu_set_virt_enabled_riscv64
                ((CPURISCVState_conflict1 *)env,(_Bool)((byte)(uint)(uVar2 >> 0x27) & 1));
    }
    return uVar1;
  }
  riscv_raise_exception_riscv64(env,0,unaff_retaddr);
}

Assistant:

target_ulong helper_mret(CPURISCVState *env, target_ulong cpu_pc_deb)
{
    if (!(env->priv >= PRV_M)) {
        riscv_raise_exception(env, RISCV_EXCP_ILLEGAL_INST, GETPC());
    }

    target_ulong retpc = env->mepc;
    if (!riscv_has_ext(env, RVC) && (retpc & 0x3)) {
        riscv_raise_exception(env, RISCV_EXCP_INST_ADDR_MIS, GETPC());
    }

    target_ulong mstatus = env->mstatus;
    target_ulong prev_priv = get_field(mstatus, MSTATUS_MPP);
    target_ulong prev_virt = MSTATUS_MPV_ISSET(env);
    mstatus = set_field(mstatus,
        env->priv_ver >= PRIV_VERSION_1_10_0 ?
        MSTATUS_MIE : MSTATUS_UIE << prev_priv,
        get_field(mstatus, MSTATUS_MPIE));
    mstatus = set_field(mstatus, MSTATUS_MPIE, 1);
    mstatus = set_field(mstatus, MSTATUS_MPP, PRV_U);
#ifdef TARGET_RISCV32
    env->mstatush = set_field(env->mstatush, MSTATUS_MPV, 0);
#else
    mstatus = set_field(mstatus, MSTATUS_MPV, 0);
#endif
    env->mstatus = mstatus;
    riscv_cpu_set_mode(env, prev_priv);

    if (riscv_has_ext(env, RVH)) {
        if (prev_virt) {
            riscv_cpu_swap_hypervisor_regs(env);
        }

        riscv_cpu_set_virt_enabled(env, prev_virt);
    }

    return retpc;
}